

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
wabt::MakeUnique<wabt::TableImport>(void)

{
  TableImport *this;
  __uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true> in_RDI;
  string_view local_20;
  
  this = (TableImport *)operator_new(0x90);
  string_view::string_view(&local_20);
  TableImport::TableImport(this,local_20);
  std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>::
  unique_ptr<std::default_delete<wabt::TableImport>,void>
            ((unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>> *)
             in_RDI.
             super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
             super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
             super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         (tuple<wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
         super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}